

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::loadDesc(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,Desc *ds)

{
  DataKey *pDVar1;
  double dVar2;
  SPxOut *pSVar3;
  SPxId *pSVar4;
  pointer pnVar5;
  char cVar6;
  byte bVar7;
  Status SVar8;
  int iVar9;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar10;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar11;
  pointer pnVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long in_FS_OFFSET;
  Verbosity old_verbosity;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  pSVar3 = this->spxout;
  if ((pSVar3 != (SPxOut *)0x0) && (4 < (int)pSVar3->m_verbosity)) {
    local_138.data._M_elems[0] = pSVar3->m_verbosity;
    local_1b8.data._M_elems[0] = 5;
    (*pSVar3->_vptr_SPxOut[2])();
    pSVar3 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],
               "IBASIS02 loading of Basis invalidates factorization",0x33);
    cVar6 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18) +
                    cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,(DataKey *)&local_138);
  }
  (this->lastin).super_DataKey = (DataKey)0xffffffff00000000;
  (this->lastout).super_DataKey = (DataKey)0xffffffff00000000;
  this->lastidx = -1;
  iVar13 = 0;
  this->iterCount = 0;
  this->updateCount = 0;
  if (&this->thedesc != ds) {
    Desc::operator=(&this->thedesc,ds);
    setRep(this);
  }
  this->nzCount = 0;
  pSVar11 = this->theLP;
  bVar7 = 1;
  if (0 < (pSVar11->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    dVar2 = *(double *)(in_FS_OFFSET + -8);
    lVar15 = 0;
    lVar14 = 0;
    iVar13 = 0;
    do {
      if ((this->thedesc).rowstat.data[lVar14] < ~P_FREE) {
        pnVar12 = (pSVar11->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((*(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar15 + 8U) != 2) &&
           (pnVar5 = (pSVar11->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           *(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar15 + 8U) != 2)) {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)
                             ((long)(pnVar12->m_backend).data._M_elems + lVar15),
                             (cpp_dec_float<200U,_int,_void> *)
                             ((long)(pnVar5->m_backend).data._M_elems + lVar15));
          if (iVar9 == 0) {
            SVar8 = P_FIXED;
            goto LAB_004f33c2;
          }
          pnVar12 = (this->theLP->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        ::soplex::infinity::__tls_init();
        local_1b8.fpclass = cpp_dec_float_finite;
        local_1b8.prec_elem = 0x1c;
        local_1b8.data._M_elems[0] = 0;
        local_1b8.data._M_elems[1] = 0;
        local_1b8.data._M_elems[2] = 0;
        local_1b8.data._M_elems[3] = 0;
        local_1b8.data._M_elems[4] = 0;
        local_1b8.data._M_elems[5] = 0;
        local_1b8.data._M_elems[6] = 0;
        local_1b8.data._M_elems[7] = 0;
        local_1b8.data._M_elems[8] = 0;
        local_1b8.data._M_elems[9] = 0;
        local_1b8.data._M_elems[10] = 0;
        local_1b8.data._M_elems[0xb] = 0;
        local_1b8.data._M_elems[0xc] = 0;
        local_1b8.data._M_elems[0xd] = 0;
        local_1b8.data._M_elems[0xe] = 0;
        local_1b8.data._M_elems[0xf] = 0;
        local_1b8.data._M_elems[0x10] = 0;
        local_1b8.data._M_elems[0x11] = 0;
        local_1b8.data._M_elems[0x12] = 0;
        local_1b8.data._M_elems[0x13] = 0;
        local_1b8.data._M_elems[0x14] = 0;
        local_1b8.data._M_elems[0x15] = 0;
        local_1b8.data._M_elems[0x16] = 0;
        local_1b8.data._M_elems[0x17] = 0;
        local_1b8.data._M_elems[0x18] = 0;
        local_1b8.data._M_elems[0x19] = 0;
        local_1b8.data._M_elems._104_5_ = 0;
        local_1b8.data._M_elems[0x1b]._1_3_ = 0;
        local_1b8.exp = 0;
        local_1b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_1b8,-dVar2);
        if (((*(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar15 + 8U) != 2) &&
            (local_1b8.fpclass != cpp_dec_float_NaN)) &&
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)(pnVar12->m_backend).data._M_elems + lVar15),&local_1b8),
           0 < iVar9)) {
          pnVar12 = (this->theLP->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_b8.fpclass = cpp_dec_float_finite;
          local_b8.prec_elem = 0x1c;
          local_b8.data._M_elems[0] = 0;
          local_b8.data._M_elems[1] = 0;
          local_b8.data._M_elems[2] = 0;
          local_b8.data._M_elems[3] = 0;
          local_b8.data._M_elems[4] = 0;
          local_b8.data._M_elems[5] = 0;
          local_b8.data._M_elems[6] = 0;
          local_b8.data._M_elems[7] = 0;
          local_b8.data._M_elems[8] = 0;
          local_b8.data._M_elems[9] = 0;
          local_b8.data._M_elems[10] = 0;
          local_b8.data._M_elems[0xb] = 0;
          local_b8.data._M_elems[0xc] = 0;
          local_b8.data._M_elems[0xd] = 0;
          local_b8.data._M_elems[0xe] = 0;
          local_b8.data._M_elems[0xf] = 0;
          local_b8.data._M_elems[0x10] = 0;
          local_b8.data._M_elems[0x11] = 0;
          local_b8.data._M_elems[0x12] = 0;
          local_b8.data._M_elems[0x13] = 0;
          local_b8.data._M_elems[0x14] = 0;
          local_b8.data._M_elems[0x15] = 0;
          local_b8.data._M_elems[0x16] = 0;
          local_b8.data._M_elems[0x17] = 0;
          local_b8.data._M_elems[0x18] = 0;
          local_b8.data._M_elems[0x19] = 0;
          local_b8.data._M_elems._104_5_ = 0;
          local_b8.data._M_elems[0x1b]._1_3_ = 0;
          local_b8.exp = 0;
          local_b8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_b8,dVar2);
          if ((((*(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar15 + 8U) != 2) &&
               (local_b8.fpclass != cpp_dec_float_NaN)) &&
              (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)(pnVar12->m_backend).data._M_elems + lVar15),&local_b8),
              -1 < iVar9)) || (SVar8 = (this->thedesc).rowstat.data[lVar14], SVar8 == P_ON_LOWER)) {
LAB_004f33b6:
            SVar8 = P_ON_LOWER;
            goto LAB_004f33c2;
          }
          if ((SVar8 != P_ON_UPPER) &&
             (pnVar12 = (this->theLP->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .object.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar15 + 8U) != 2)) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&local_138,0,(type *)0x0);
            iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)(pnVar12->m_backend).data._M_elems + lVar15),&local_138);
            if (iVar9 < 1) goto LAB_004f33b6;
          }
        }
        pnVar12 = (this->theLP->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 0x1c;
        local_138.data._M_elems[0] = 0;
        local_138.data._M_elems[1] = 0;
        local_138.data._M_elems[2] = 0;
        local_138.data._M_elems[3] = 0;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems[6] = 0;
        local_138.data._M_elems[7] = 0;
        local_138.data._M_elems[8] = 0;
        local_138.data._M_elems[9] = 0;
        local_138.data._M_elems[10] = 0;
        local_138.data._M_elems[0xb] = 0;
        local_138.data._M_elems[0xc] = 0;
        local_138.data._M_elems[0xd] = 0;
        local_138.data._M_elems[0xe] = 0;
        local_138.data._M_elems[0xf] = 0;
        local_138.data._M_elems[0x10] = 0;
        local_138.data._M_elems[0x11] = 0;
        local_138.data._M_elems[0x12] = 0;
        local_138.data._M_elems[0x13] = 0;
        local_138.data._M_elems[0x14] = 0;
        local_138.data._M_elems[0x15] = 0;
        local_138.data._M_elems[0x16] = 0;
        local_138.data._M_elems[0x17] = 0;
        local_138.data._M_elems[0x18] = 0;
        local_138.data._M_elems[0x19] = 0;
        local_138.data._M_elems._104_5_ = 0;
        local_138.data._M_elems[0x1b]._1_3_ = 0;
        local_138.exp = 0;
        local_138.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_138,dVar2);
        if (((*(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar15 + 8U) == 2) ||
            (local_138.fpclass == cpp_dec_float_NaN)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)(pnVar12->m_backend).data._M_elems + lVar15),&local_138),
           -1 < iVar9)) {
          SVar8 = P_FREE;
        }
        else {
          SVar8 = P_ON_UPPER;
        }
      }
      else {
        SVar8 = dualRowStatus(this,(int)lVar14);
      }
LAB_004f33c2:
      (this->thedesc).rowstat.data[lVar14] = SVar8;
      pSVar11 = this->theLP;
      if (0 < SVar8 * pSVar11->theRep) {
        if (iVar13 == (this->matrix).thesize) {
          bVar7 = 0;
          break;
        }
        local_1b8.data._M_elems._0_8_ =
             (pSVar11->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[lVar14];
        SPxRowId::SPxRowId((SPxRowId *)&local_138,(DataKey *)&local_1b8);
        pSVar4 = (this->theBaseId).data;
        pDVar1 = &pSVar4[iVar13].super_DataKey;
        pDVar1->info = local_138.data._M_elems[0];
        pDVar1->idx = local_138.data._M_elems[1];
        pSVar4[iVar13].super_DataKey.info = -1;
        pSVar10 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::vector(this->theLP,(SPxRowId *)&local_138);
        (this->matrix).data[iVar13] = pSVar10;
        this->nzCount = this->nzCount + (this->matrix).data[iVar13]->memused;
        pSVar11 = this->theLP;
        iVar13 = iVar13 + 1;
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0x80;
    } while (lVar14 < (pSVar11->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if (0 < (pSVar11->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    dVar2 = *(double *)(in_FS_OFFSET + -8);
    lVar15 = 0;
    lVar14 = 0;
    do {
      if ((this->thedesc).colstat.data[lVar14] < ~P_FREE) {
        pnVar12 = (pSVar11->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((*(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar15 + 8U) != 2) &&
           (pnVar5 = (pSVar11->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           *(int *)((long)(&(pnVar5->m_backend).data + 1) + lVar15 + 8U) != 2)) {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)
                             ((long)(pnVar12->m_backend).data._M_elems + lVar15),
                             (cpp_dec_float<200U,_int,_void> *)
                             ((long)(pnVar5->m_backend).data._M_elems + lVar15));
          if (iVar9 == 0) {
            SVar8 = P_FIXED;
            goto LAB_004f3758;
          }
          pnVar12 = (this->theLP->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        ::soplex::infinity::__tls_init();
        local_1b8.fpclass = cpp_dec_float_finite;
        local_1b8.prec_elem = 0x1c;
        local_1b8.data._M_elems[0] = 0;
        local_1b8.data._M_elems[1] = 0;
        local_1b8.data._M_elems[2] = 0;
        local_1b8.data._M_elems[3] = 0;
        local_1b8.data._M_elems[4] = 0;
        local_1b8.data._M_elems[5] = 0;
        local_1b8.data._M_elems[6] = 0;
        local_1b8.data._M_elems[7] = 0;
        local_1b8.data._M_elems[8] = 0;
        local_1b8.data._M_elems[9] = 0;
        local_1b8.data._M_elems[10] = 0;
        local_1b8.data._M_elems[0xb] = 0;
        local_1b8.data._M_elems[0xc] = 0;
        local_1b8.data._M_elems[0xd] = 0;
        local_1b8.data._M_elems[0xe] = 0;
        local_1b8.data._M_elems[0xf] = 0;
        local_1b8.data._M_elems[0x10] = 0;
        local_1b8.data._M_elems[0x11] = 0;
        local_1b8.data._M_elems[0x12] = 0;
        local_1b8.data._M_elems[0x13] = 0;
        local_1b8.data._M_elems[0x14] = 0;
        local_1b8.data._M_elems[0x15] = 0;
        local_1b8.data._M_elems[0x16] = 0;
        local_1b8.data._M_elems[0x17] = 0;
        local_1b8.data._M_elems[0x18] = 0;
        local_1b8.data._M_elems[0x19] = 0;
        local_1b8.data._M_elems._104_5_ = 0;
        local_1b8.data._M_elems[0x1b]._1_3_ = 0;
        local_1b8.exp = 0;
        local_1b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_1b8,-dVar2);
        if (((*(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar15 + 8U) != 2) &&
            (local_1b8.fpclass != cpp_dec_float_NaN)) &&
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)(pnVar12->m_backend).data._M_elems + lVar15),&local_1b8),
           0 < iVar9)) {
          pnVar12 = (this->theLP->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_b8.fpclass = cpp_dec_float_finite;
          local_b8.prec_elem = 0x1c;
          local_b8.data._M_elems[0] = 0;
          local_b8.data._M_elems[1] = 0;
          local_b8.data._M_elems[2] = 0;
          local_b8.data._M_elems[3] = 0;
          local_b8.data._M_elems[4] = 0;
          local_b8.data._M_elems[5] = 0;
          local_b8.data._M_elems[6] = 0;
          local_b8.data._M_elems[7] = 0;
          local_b8.data._M_elems[8] = 0;
          local_b8.data._M_elems[9] = 0;
          local_b8.data._M_elems[10] = 0;
          local_b8.data._M_elems[0xb] = 0;
          local_b8.data._M_elems[0xc] = 0;
          local_b8.data._M_elems[0xd] = 0;
          local_b8.data._M_elems[0xe] = 0;
          local_b8.data._M_elems[0xf] = 0;
          local_b8.data._M_elems[0x10] = 0;
          local_b8.data._M_elems[0x11] = 0;
          local_b8.data._M_elems[0x12] = 0;
          local_b8.data._M_elems[0x13] = 0;
          local_b8.data._M_elems[0x14] = 0;
          local_b8.data._M_elems[0x15] = 0;
          local_b8.data._M_elems[0x16] = 0;
          local_b8.data._M_elems[0x17] = 0;
          local_b8.data._M_elems[0x18] = 0;
          local_b8.data._M_elems[0x19] = 0;
          local_b8.data._M_elems._104_5_ = 0;
          local_b8.data._M_elems[0x1b]._1_3_ = 0;
          local_b8.exp = 0;
          local_b8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_b8,dVar2);
          if ((((*(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar15 + 8U) != 2) &&
               (local_b8.fpclass != cpp_dec_float_NaN)) &&
              (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)(pnVar12->m_backend).data._M_elems + lVar15),&local_b8),
              -1 < iVar9)) || (SVar8 = (this->thedesc).colstat.data[lVar14], SVar8 == P_ON_LOWER)) {
LAB_004f374c:
            SVar8 = P_ON_LOWER;
            goto LAB_004f3758;
          }
          if ((SVar8 != P_ON_UPPER) &&
             (pnVar12 = (this->theLP->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .object.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar15 + 8U) != 2)) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&local_138,0,(type *)0x0);
            iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)(pnVar12->m_backend).data._M_elems + lVar15),&local_138);
            if (iVar9 < 1) goto LAB_004f374c;
          }
        }
        pnVar12 = (this->theLP->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 0x1c;
        local_138.data._M_elems[0] = 0;
        local_138.data._M_elems[1] = 0;
        local_138.data._M_elems[2] = 0;
        local_138.data._M_elems[3] = 0;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems[6] = 0;
        local_138.data._M_elems[7] = 0;
        local_138.data._M_elems[8] = 0;
        local_138.data._M_elems[9] = 0;
        local_138.data._M_elems[10] = 0;
        local_138.data._M_elems[0xb] = 0;
        local_138.data._M_elems[0xc] = 0;
        local_138.data._M_elems[0xd] = 0;
        local_138.data._M_elems[0xe] = 0;
        local_138.data._M_elems[0xf] = 0;
        local_138.data._M_elems[0x10] = 0;
        local_138.data._M_elems[0x11] = 0;
        local_138.data._M_elems[0x12] = 0;
        local_138.data._M_elems[0x13] = 0;
        local_138.data._M_elems[0x14] = 0;
        local_138.data._M_elems[0x15] = 0;
        local_138.data._M_elems[0x16] = 0;
        local_138.data._M_elems[0x17] = 0;
        local_138.data._M_elems[0x18] = 0;
        local_138.data._M_elems[0x19] = 0;
        local_138.data._M_elems._104_5_ = 0;
        local_138.data._M_elems[0x1b]._1_3_ = 0;
        local_138.exp = 0;
        local_138.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_138,dVar2);
        if (((*(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar15 + 8U) == 2) ||
            (local_138.fpclass == cpp_dec_float_NaN)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)(pnVar12->m_backend).data._M_elems + lVar15),&local_138),
           -1 < iVar9)) {
          SVar8 = P_FREE;
        }
        else {
          SVar8 = P_ON_UPPER;
        }
      }
      else {
        SVar8 = dualColStatus(this,(int)lVar14);
      }
LAB_004f3758:
      (this->thedesc).colstat.data[lVar14] = SVar8;
      pSVar11 = this->theLP;
      if (0 < SVar8 * pSVar11->theRep) {
        if (iVar13 == (this->matrix).thesize) goto LAB_004f3811;
        local_1b8.data._M_elems._0_8_ =
             (pSVar11->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[lVar14];
        SPxColId::SPxColId((SPxColId *)&local_138,(DataKey *)&local_1b8);
        pSVar4 = (this->theBaseId).data;
        pDVar1 = &pSVar4[iVar13].super_DataKey;
        pDVar1->info = local_138.data._M_elems[0];
        pDVar1->idx = local_138.data._M_elems[1];
        pSVar4[iVar13].super_DataKey.info = 1;
        pSVar10 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::vector(this->theLP,(SPxColId *)&local_138);
        (this->matrix).data[iVar13] = pSVar10;
        this->nzCount = this->nzCount + (this->matrix).data[iVar13]->memused;
        pSVar11 = this->theLP;
        iVar13 = iVar13 + 1;
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0x80;
    } while (lVar14 < (pSVar11->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if ((bool)(bVar7 & (this->matrix).thesize <= iVar13)) {
    this->matrixIsSetup = true;
  }
  else {
LAB_004f3811:
    restoreInitialBasis(this);
  }
  this->factorized = false;
  if (this->factor !=
      (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    (*this->factor->_vptr_SLinSolver[2])();
  }
  return;
}

Assistant:

void SPxBasisBase<R>::loadDesc(const Desc& ds)
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);
   assert(ds.nRows() == theLP->nRows());
   assert(ds.nCols() == theLP->nCols());

   SPxId none;
   int   i;
   int   j;
   bool consistent = true;

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS02 loading of Basis invalidates factorization"
                 << std::endl;)

   lastin      = none;
   lastout     = none;
   lastidx     = -1;
   iterCount   = 0;
   updateCount = 0;

   if(&ds != &thedesc)
   {
      thedesc = ds;
      setRep();
   }

   assert(theLP->dim() == matrix.size());

   nzCount = 0;

   for(j = i = 0; i < theLP->nRows(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.rowStatus(i) >= 0)
         thedesc.rowStatus(i) = dualRowStatus(i);
      else if(theLP->SPxLPBase<R>::lhs(i) == theLP->SPxLPBase<R>::rhs(i))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lhs(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::rhs(i) >= R(infinity)
                  || thedesc.rowStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.rowStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxRowObj(i) <= 0)))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::rhs(i) < R(infinity))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.rowStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxRowId id = theLP->SPxLPBase<R>::rId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   for(i = 0; i < theLP->nCols(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.colStatus(i) >= 0)
         thedesc.colStatus(i) = dualColStatus(i);
      else if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::upper(i) >= R(infinity)
                  || thedesc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.colStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxObj(i) <= 0)))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::upper(i) < R(infinity))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.colStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxColId id = theLP->SPxLPBase<R>::cId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   if(j < matrix.size())
      consistent = false;  // not enough basic variables

   /* if dimensions are inconsistent, restore slack basis
    * if dimensions are consistent, then we have setup a correct matrix
    */
   if(!consistent)
      restoreInitialBasis();
   else
      matrixIsSetup = true;

   assert(isDescValid(thedesc));

   factorized = false;

   if(factor != nullptr)
      factor->clear();
}